

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

double chooseK(int n,int k)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 1.0;
  uVar1 = n - k;
  if (k <= n - k) {
    uVar1 = k;
  }
  for (iVar2 = 1; iVar2 - (~((int)uVar1 >> 0x1f) & uVar1) != 1; iVar2 = iVar2 + 1) {
    dVar4 = (double)n;
    n = n + -1;
    dVar3 = dVar3 * (dVar4 / (double)iVar2);
  }
  return dVar3;
}

Assistant:

double chooseK ( int n, int k )
{
  if(k > (n - k)) k = n - k;

  double c = 1;

  for(int i = 0; i < k; i++)
  {
    double t = double(n-i) / double(i+1);

    c *= t;
  }

    return c;
}